

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O2

int shm_queue_push_begin(QcShmQue *shmQue,int *idx,char **pp_buff,int *p_bufflen,QcErr *err)

{
  long lVar1;
  P_ShmQue *pPVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = -1;
  qc_sem_wait(shmQue->sem_lst,-1);
  iVar3 = qc_staticlist_count(&shmQue->p_shmQue->lst_free);
  if (iVar3 == 0) {
    qc_seterr(err,-1,"alloc failed, no free unit in queue(%s).");
    qc_sem_post(shmQue->sem_lst);
  }
  else {
    uVar4 = qc_staticlist_get_head(&shmQue->p_shmQue->lst_free);
    if ((int)uVar4 < 0) {
      fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
              ,0xfa);
      __assert_fail("index>=0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
                    ,0xfa,"int shm_queue_push_begin(QcShmQue *, int *, char **, int *, QcErr *)");
    }
    qc_sem_post(shmQue->sem_lst);
    *idx = uVar4;
    lVar7 = (ulong)uVar4 * ((long)shmQue->p_shmQue->msg_size + 8);
    pcVar5 = qc_shm_getaddr(shmQue->qcShm);
    lVar1 = shmQue->p_shmQue->data_offset;
    *pp_buff = pcVar5 + lVar7 + lVar1;
    pPVar2 = shmQue->p_shmQue;
    *p_bufflen = pPVar2->msg_size;
    *(int *)(pcVar5 + lVar7 + lVar1) = pPVar2->msg_size;
    *pp_buff = (char *)((long)(pcVar5 + lVar7 + lVar1) + 8);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int shm_queue_push_begin(QcShmQue* shmQue, int *idx, char **pp_buff, int *p_bufflen, QcErr *err)
{
    int index;
    off_t buf_offset;

    qc_sem_wait(shmQue->sem_lst, -1);

	if (0 == qc_staticlist_count(&shmQue->p_shmQue->lst_free))
	{
		qc_seterr(err, -1, "alloc failed, no free unit in queue(%s).", shmQue->p_shmQue->quename);
        qc_sem_post(shmQue->sem_lst);
        return -1;
	}

    index = qc_staticlist_get_head(&shmQue->p_shmQue->lst_free);
	qc_assert(index>=0);

    qc_sem_post(shmQue->sem_lst);

    *idx = index;
    buf_offset = (sizeof(off_t) + shmQue->p_shmQue->msg_size) * index;
    *pp_buff = (char*)qc_shm_getaddr(shmQue->qcShm) + shmQue->p_shmQue->data_offset + buf_offset;
    *p_bufflen = shmQue->p_shmQue->msg_size;
    *((int*)*pp_buff) = shmQue->p_shmQue->msg_size;
    *pp_buff += sizeof(off_t);

    return 0;
}